

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::clearColor
          (ReadPixelsTest *this,float r,float g,float b,float a)

{
  GLenum GVar1;
  deBool dVar2;
  float local_58;
  float local_54;
  GLfloat color_2 [4];
  GLuint color_1 [4];
  GLint color [4];
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  ReadPixelsTest *this_local;
  
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_NATIVE) {
    do {
      glwClearColor(r,g,b,a);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glClearColor(r, g, b, a)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                      ,0x150);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      glwClear(0x4000);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                      ,0x151);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  else if (this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER) {
    switch(this->m_texChannelClass) {
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      do {
        glwClearColor(r,g,b,a);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glClearColor(r, g, b, a)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                        ,0x159);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      do {
        glwClear(0x4000);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                        ,0x15a);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      color_1[2] = (GLuint)r;
      color_1[3] = (GLuint)g;
      do {
        glwClearBufferiv(0x1800,0,(GLint *)(color_1 + 2));
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glClearBufferiv(GL_COLOR, 0, color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                        ,0x162);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      color_2[2] = (GLfloat)(long)r;
      color_2[3] = (GLfloat)(long)g;
      color_1[0] = (GLuint)(long)b;
      color_1[1] = (GLuint)(long)a;
      do {
        glwClearBufferuiv(0x1800,0,(GLuint *)(color_2 + 2));
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glClearBufferuiv(GL_COLOR, 0, color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                        ,0x16a);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      break;
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      local_58 = r;
      local_54 = g;
      color_2[0] = b;
      color_2[1] = a;
      do {
        glwClearBufferfv(0x1800,0,&local_58);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glClearBufferfv(GL_COLOR, 0, color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                        ,0x172);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
  }
  return;
}

Assistant:

void ReadPixelsTest::clearColor (float r, float g, float b, float a)
{
	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		GLU_CHECK_CALL(glClearColor(r, g, b, a));
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				GLU_CHECK_CALL(glClearColor(r, g, b, a));
				GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			{
				GLint color[4] = { (GLint)r, (GLint)g, (GLint)b, (GLint)a };

				GLU_CHECK_CALL(glClearBufferiv(GL_COLOR, 0, color));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				GLuint color[4] = { (GLuint)r, (GLuint)g, (GLuint)b, (GLuint)a };

				GLU_CHECK_CALL(glClearBufferuiv(GL_COLOR, 0, color));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				GLfloat color[4] = { (GLfloat)r, (GLfloat)g, (GLfloat)b, (GLfloat)a };

				GLU_CHECK_CALL(glClearBufferfv(GL_COLOR, 0, color));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);

}